

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

Metadata google::protobuf::Message::GetMetadataImpl(ClassDataFull *data)

{
  DescriptorTable *pDVar1;
  anon_class_8_1_a8aa2aee *in_RDX;
  anon_class_8_1_a8aa2aee *extraout_RDX;
  Metadata MVar2;
  DescriptorTable *local_18;
  
  pDVar1 = data->descriptor_table;
  if (pDVar1 != (DescriptorTable *)0x0) {
    if (data->get_metadata_tracker != (_func_void *)0x0) {
      (*data->get_metadata_tracker)();
      in_RDX = extraout_RDX;
    }
    if ((pDVar1->once->control_).super___atomic_base<unsigned_int>._M_i != 0xdd) {
      local_18 = pDVar1;
      absl::lts_20250127::base_internal::
      CallOnceImpl<google::protobuf::Message::GetMetadataImpl(google::protobuf::internal::ClassDataFull_const&)::__0>
                (&pDVar1->once->control_,(SchedulingMode)&local_18,in_RDX);
    }
  }
  MVar2.reflection = data->reflection;
  MVar2.descriptor = data->descriptor;
  return MVar2;
}

Assistant:

Metadata Message::GetMetadataImpl(const internal::ClassDataFull& data) {
  auto* table = data.descriptor_table;
  // Only codegen types provide a table. DynamicMessage does not provide a table
  // and instead eagerly initializes the descriptor/reflection members.
  if (ABSL_PREDICT_TRUE(table != nullptr)) {
    if (ABSL_PREDICT_FALSE(data.get_metadata_tracker != nullptr)) {
      data.get_metadata_tracker();
    }
    absl::call_once(*table->once, [table] {
      internal::AssignDescriptorsOnceInnerCall(table);
    });
  }
  return {data.descriptor, data.reflection};
}